

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildReturn(CNscPStackEntry *pReturn)

{
  NscType NVar1;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  CNscContext *pCVar4;
  CNscPStackEntry *this;
  NscSymbolFence *pNVar5;
  CNwnDoubleLinkList *pCVar6;
  CNwnDoubleLinkList *pNext;
  CNwnDoubleLinkList *pNext_1;
  NscMessage nMessage;
  uchar *pauchData;
  size_t nDataSize;
  NscType nType;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar4 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pReturn != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(pReturn->m_link).m_pNext;
      if (pCVar3 != pReturn) {
        pCVar6 = (pReturn->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar6;
        pCVar6->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (pReturn->m_link).m_pNext = &pReturn->m_link;
        (pReturn->m_link).m_pPrev = &pReturn->m_link;
      }
      pCVar6 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pReturn) {
        pCVar6 = pCVar2;
      }
      pCVar2 = pCVar6->m_pNext;
      (pReturn->m_link).m_pNext = pCVar2;
      (pReturn->m_link).m_pPrev = pCVar6;
      pCVar6->m_pNext = &pReturn->m_link;
      pCVar2->m_pPrev = &pReturn->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
  }
  else {
    nType = NscType_Unknown;
    if (pReturn == (CNscPStackEntry *)0x0) {
      pauchData = (uchar *)0x0;
      nDataSize = 0;
    }
    else {
      if (pReturn->m_nType == NscType_Error) {
        if (this->m_nType != NscType_Unknown) goto LAB_0015351e;
        this->m_nType = NscType_Error;
        goto LAB_001534c4;
      }
      pauchData = pReturn->m_pauchData;
      nDataSize = pReturn->m_nDataSize;
    }
    if (nDataSize != 0) {
      nType = pReturn->m_nType;
    }
    nMessage = NscMessage_ErrorReturnOutsideFunction;
    for (pNVar5 = g_pCtx->m_pCurrentFence; pNVar5 != (NscSymbolFence *)0x0; pNVar5 = pNVar5->pNext)
    {
      if (pNVar5->nFnSymbol != 0) {
        NVar1 = *(NscType *)((g_pCtx->m_sSymbols).m_pauchData + pNVar5->nFnSymbol + 0x20);
        if ((((nType != NscType_Unknown) ||
             (nMessage = NscMessage_ErrorReturnValueExpected, NVar1 == NscType_Void)) &&
            ((nType == NscType_Unknown ||
             (nMessage = NscMessage_ErrorReturnValueIllegalOnVoidFn, NVar1 != NscType_Void)))) &&
           (nMessage = NscMessage_ErrorTypeMismatchOnReturn, nType == NVar1 || NVar1 == NscType_Void
           )) goto LAB_0015348e;
        break;
      }
    }
    CNscContext::GenerateMessage(g_pCtx,nMessage);
LAB_0015348e:
    CNscPStackEntry::PushReturn(this,nType,pauchData,nDataSize);
    if (g_pCtx->m_fOptReturn == true) {
      nType = NscType_Unknown;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = nType;
      NscSetFenceReturn(true);
LAB_001534c4:
      pCVar4 = g_pCtx;
      if (pReturn != (CNscPStackEntry *)0x0) {
        pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
        pCVar3 = (CNscPStackEntry *)(pReturn->m_link).m_pNext;
        if (pCVar3 != pReturn) {
          pCVar6 = (pReturn->m_link).m_pPrev;
          (pCVar3->m_link).m_pPrev = pCVar6;
          pCVar6->m_pNext = (CNwnDoubleLinkList *)pCVar3;
          (pReturn->m_link).m_pNext = &pReturn->m_link;
          (pReturn->m_link).m_pPrev = &pReturn->m_link;
        }
        pCVar6 = &pCVar4->m_listEntryFree;
        if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pReturn) {
          pCVar6 = pCVar2;
        }
        pCVar2 = pCVar6->m_pNext;
        (pReturn->m_link).m_pNext = pCVar2;
        (pReturn->m_link).m_pPrev = pCVar6;
        pCVar6->m_pNext = &pReturn->m_link;
        pCVar2->m_pPrev = &pReturn->m_link;
      }
      return this;
    }
  }
LAB_0015351e:
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildReturn (YYSTYPE pReturn)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pReturn)
			g_pCtx ->FreePStackEntry (pReturn);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pReturn != NULL && pReturn ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the data
		//

		unsigned char *pauchData = NULL;
		size_t nDataSize = 0;
		if (pReturn)
		{
			pauchData = pReturn ->GetData ();
			nDataSize = pReturn ->GetDataSize ();
		} 

		//
		// Get the return type
		//

		NscType nType;
		if (nDataSize > 0)
			nType = pReturn ->GetType ();
		else
			nType = NscType_Unknown;

		//
		// Get the return type of the function
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		while (pFence && pFence ->nFnSymbol == 0)
			pFence = pFence ->pNext;
		if (pFence)
		{
			NscSymbol *pSymbol = g_pCtx ->GetSymbol (pFence ->nFnSymbol);
			if (pSymbol ->nType != NscType_Void && nType == NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorReturnValueExpected);
			}
			else if (pSymbol ->nType == NscType_Void && nType != NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorReturnValueIllegalOnVoidFn);
			}
			else if (pSymbol ->nType != NscType_Void && nType != pSymbol ->nType)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTypeMismatchOnReturn);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorReturnOutsideFunction);
		}

		//
		// Push the return
		//

		pOut ->PushReturn (nType, pauchData, nDataSize);
		if (g_pCtx ->GetOptReturn ())
        	pOut ->SetType (NscType_Unknown);
		else
        	pOut ->SetType (nType);

		//
		// Set the fence
		//

		NscSetFenceReturn (true);
	}

	//
	// Return results
	//

	if (pReturn)
        g_pCtx ->FreePStackEntry (pReturn);
	return pOut;
}